

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_promise_executor(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic,
                           JSValue *func_data)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  long lVar3;
  int *piVar4;
  ulong uVar5;
  undefined4 in_register_0000008c;
  int *piVar6;
  
  piVar6 = (int *)CONCAT44(in_register_0000008c,magic);
  piVar4 = (int *)this_val.tag;
  lVar3 = 0;
  do {
    if (*(int *)((long)&func_data->tag + lVar3) != 3) {
      JS_ThrowTypeError(ctx,"resolving function already set",piVar4,lVar3,argv,piVar6);
      uVar5 = 6;
      goto LAB_00148853;
    }
    piVar4 = *(int **)((long)&argv->u + lVar3);
    uVar1 = *(undefined8 *)((long)&argv->tag + lVar3);
    if (0xfffffff4 < (uint)uVar1) {
      *piVar4 = *piVar4 + 1;
      piVar6 = piVar4;
    }
    *(int **)((long)&func_data->u + lVar3) = piVar4;
    *(undefined8 *)((long)&func_data->tag + lVar3) = uVar1;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 == 0x10);
  uVar5 = 3;
LAB_00148853:
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  return (JSValue)(auVar2 << 0x40);
}

Assistant:

static JSValue js_promise_executor(JSContext *ctx,
                                   JSValueConst this_val,
                                   int argc, JSValueConst *argv,
                                   int magic, JSValue *func_data)
{
    int i;

    for(i = 0; i < 2; i++) {
        if (!JS_IsUndefined(func_data[i]))
            return JS_ThrowTypeError(ctx, "resolving function already set");
        func_data[i] = JS_DupValue(ctx, argv[i]);
    }
    return JS_UNDEFINED;
}